

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::read_dqt_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  jpgd_quant_t *pjVar4;
  uint uVar5;
  long lVar6;
  short sVar7;
  bool bVar8;
  
  uVar1 = get_bits(this,0x10);
  if (uVar1 < 2) {
    stop_decoding(this,JPGD_BAD_DQT_MARKER);
  }
  uVar5 = uVar1 - 2;
  while( true ) {
    if (uVar5 == 0) {
      return;
    }
    uVar1 = get_bits(this,8);
    uVar2 = uVar1 & 0xf;
    if (3 < uVar2) break;
    if (this->m_quant[uVar2] == (jpgd_quant_t *)0x0) {
      pjVar4 = (jpgd_quant_t *)alloc(this,0x80,false);
      this->m_quant[uVar2] = pjVar4;
    }
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      uVar3 = get_bits(this,8);
      sVar7 = (short)uVar3;
      if (0xf < uVar1) {
        uVar3 = get_bits(this,8);
        sVar7 = sVar7 * 0x100 + (short)uVar3;
      }
      this->m_quant[uVar2][lVar6] = sVar7;
    }
    uVar2 = (uint)(0xf < uVar1) * 0x40 + 0x41;
    bVar8 = uVar5 < uVar2;
    uVar5 = uVar5 - uVar2;
    if (bVar8) {
      stop_decoding(this,JPGD_BAD_DQT_LENGTH);
    }
  }
  stop_decoding(this,JPGD_BAD_DQT_TABLE);
}

Assistant:

void jpeg_decoder::read_dqt_marker() {
  int n, i, prec;
  uint num_left;
  uint temp;

  num_left = get_bits(16);

  if (num_left < 2)
    stop_decoding(JPGD_BAD_DQT_MARKER);

  num_left -= 2;

  while (num_left) {
    n = get_bits(8);
    prec = n >> 4;
    n &= 0x0F;

    if (n >= JPGD_MAX_QUANT_TABLES)
      stop_decoding(JPGD_BAD_DQT_TABLE);

    if (!m_quant[n])
      m_quant[n] = (jpgd_quant_t*)alloc(64 * sizeof(jpgd_quant_t));

    // read quantization entries, in zag order
    for (i = 0; i < 64; i++) {
      temp = get_bits(8);

      if (prec)
        temp = (temp << 8) + get_bits(8);

      m_quant[n][i] = static_cast<jpgd_quant_t>(temp);
    }

    i = 64 + 1;

    if (prec)
      i += 64;

    if (num_left < (uint)i)
      stop_decoding(JPGD_BAD_DQT_LENGTH);

    num_left -= i;
  }
}